

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O3

int x86MOVSS(uchar *stream,x86Size size,x86Reg index,int multiplier,x86Reg base,int shift,
            x86XmmReg src)

{
  byte *pbVar1;
  uint uVar2;
  byte bVar3;
  bool bVar4;
  
  if (size != sDWORD) {
    __assert_fail("size == sDWORD",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Translator_X86.cpp"
                  ,0x11d,
                  "int x86MOVSS(unsigned char *, x86Size, x86Reg, int, x86Reg, int, x86XmmReg)");
  }
  pbVar1 = stream + 1;
  *stream = 0xf3;
  bVar3 = 8 < (int)base | (8 < (int)index) * '\x02' | (7 < (int)src) << 2;
  bVar4 = bVar3 != 0;
  if (bVar4) {
    *pbVar1 = bVar3 | 0x40;
  }
  (stream + (ulong)bVar4 + 1)[0] = '\x0f';
  (stream + (ulong)bVar4 + 1)[1] = '\x11';
  uVar2 = encodeAddress(pbVar1 + (ulong)bVar4 + 2,index,multiplier,base,shift,(int)(char)src);
  return (uVar2 + (int)(pbVar1 + (ulong)bVar4 + 2)) - (int)stream;
}

Assistant:

int x86MOVSS(unsigned char *stream, x86Size size, x86Reg index, int multiplier, x86Reg base, int shift, x86XmmReg src)
{
	unsigned char *start = stream;

	assert(size == sDWORD);
	(void)size;

	*stream++ = 0xf3;
	stream += encodeRex(stream, false, src, index, base);
	*stream++ = 0x0f;
	*stream++ = 0x11;
	stream += encodeAddress(stream, index, multiplier, base, shift, (char)src);

	return int(stream - start);
}